

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

string * antlr::operator+(string *lhs,size_t rhs)

{
  undefined8 in_RDX;
  string *in_RDI;
  char tmp [100];
  char local_88 [24];
  char *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  
  snprintf(local_88,100,"%lu",in_RDX);
  std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  return in_RDI;
}

Assistant:

string operator+( const ANTLR_USE_NAMESPACE(std)string& lhs, size_t rhs )
{
	char tmp[100];
        snprintf(tmp,100,"%lu",(unsigned long)rhs);
	return lhs+tmp;
}